

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5CloseMethod(sqlite3_vtab_cursor *pCursor)

{
  sqlite3_vtab *psVar1;
  sqlite3_vtab_cursor sVar2;
  _func_int_sqlite3_vtab_cursor_ptr_sqlite3_context_ptr_int **pp_Var3;
  _func_int_sqlite3_vtab_cursor_ptr_sqlite3_context_ptr_int **pp_Var4;
  
  if (pCursor != (sqlite3_vtab_cursor *)0x0) {
    psVar1 = pCursor->pVtab;
    fts5FreeCursorComponents((Fts5Cursor *)pCursor);
    pp_Var3 = &(psVar1[2].pModule)->xColumn;
    do {
      pp_Var4 = pp_Var3;
      sVar2.pVtab = (sqlite3_vtab *)*pp_Var4;
      pp_Var3 = (_func_int_sqlite3_vtab_cursor_ptr_sqlite3_context_ptr_int **)&(sVar2.pVtab)->nRef;
    } while (sVar2.pVtab != (sqlite3_vtab *)pCursor);
    *pp_Var4 = (_func_int_sqlite3_vtab_cursor_ptr_sqlite3_context_ptr_int *)pCursor[1].pVtab;
    sqlite3_free(pCursor);
  }
  return 0;
}

Assistant:

static int fts5CloseMethod(sqlite3_vtab_cursor *pCursor){
  if( pCursor ){
    Fts5FullTable *pTab = (Fts5FullTable*)(pCursor->pVtab);
    Fts5Cursor *pCsr = (Fts5Cursor*)pCursor;
    Fts5Cursor **pp;

    fts5FreeCursorComponents(pCsr);
    /* Remove the cursor from the Fts5Global.pCsr list */
    for(pp=&pTab->pGlobal->pCsr; (*pp)!=pCsr; pp=&(*pp)->pNext);
    *pp = pCsr->pNext;

    sqlite3_free(pCsr);
  }
  return SQLITE_OK;
}